

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::HexEncoderTest_test_encode_as_hex_offset_Test::TestBody
          (HexEncoderTest_test_encode_as_hex_offset_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_128;
  Message local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_3;
  Message local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_2;
  Message local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_60;
  Message local_58 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  HexEncoderTest_test_encode_as_hex_offset_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_40,0x323425,0,0);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_20,"\"\"",
             "HexEncoder::EncodeAsHex((unsigned char *) \":`a]{\", 0, 0, 5)",(char (*) [1])0x310d18,
             &local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_98,0x323425,3,0);
    testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
              ((EqHelper<false> *)local_78,"\"\"",
               "HexEncoder::EncodeAsHex((unsigned char *) \":`a]{\", 3, 0, 5)",
               (char (*) [1])0x310d18,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                 ,0x26,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_a0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_d8,0x323425,3,5);
      testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
                ((EqHelper<false> *)local_b8,"\"5d7b\"",
                 "HexEncoder::EncodeAsHex((unsigned char *) \":`a]{\", 3, 5, 5)",
                 (char (*) [5])0x323420,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
      if (!bVar1) {
        testing::Message::Message(&local_e0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                   ,0x27,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_e0);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_
                  ((uchar *)&local_118,0x323425,0,5);
        testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
                  ((EqHelper<false> *)local_f8,"\"3a60615d7b\"",
                   "HexEncoder::EncodeAsHex((unsigned char *) \":`a]{\", 0, 5, 5)",
                   (char (*) [11])"3a60615d7b",&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                     ,0x28,pcVar2);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          testing::Message::~Message(&local_120);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
      }
    }
  }
  return;
}

Assistant:

TEST(HexEncoderTest, test_encode_as_hex_offset)
{
    ASSERT_EQ("", HexEncoder::EncodeAsHex((unsigned char *) ":`a]{", 0, 0, 5));
    ASSERT_EQ("", HexEncoder::EncodeAsHex((unsigned char *) ":`a]{", 3, 0, 5));
    ASSERT_EQ("5d7b", HexEncoder::EncodeAsHex((unsigned char *) ":`a]{", 3, 5, 5));
    ASSERT_EQ("3a60615d7b", HexEncoder::EncodeAsHex((unsigned char *) ":`a]{", 0, 5, 5));
}